

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O1

void helper_msa_ceq_h_mips64(CPUMIPSState_conflict5 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  lVar1 = (ulong)wd * 0x10;
  lVar3 = (ulong)ws * 0x10;
  lVar2 = (ulong)wt * 0x10;
  *(ushort *)((env->active_fpu).fpr + wd) =
       -(ushort)(*(short *)((env->active_fpu).fpr + ws) == *(short *)((env->active_fpu).fpr + wt));
  *(ushort *)((long)(env->active_fpu).fpr + lVar1 + 2) =
       -(ushort)(*(short *)((long)(env->active_fpu).fpr + lVar3 + 2) ==
                *(short *)((long)(env->active_fpu).fpr + lVar2 + 2));
  *(ushort *)((long)(env->active_fpu).fpr + lVar1 + 4) =
       -(ushort)(*(short *)((long)(env->active_fpu).fpr + lVar3 + 4) ==
                *(short *)((long)(env->active_fpu).fpr + lVar2 + 4));
  *(ushort *)((long)(env->active_fpu).fpr + lVar1 + 6) =
       -(ushort)(*(short *)((long)(env->active_fpu).fpr + lVar3 + 6) ==
                *(short *)((long)(env->active_fpu).fpr + lVar2 + 6));
  *(ushort *)((long)(env->active_fpu).fpr + lVar1 + 8) =
       -(ushort)(*(short *)((long)(env->active_fpu).fpr + lVar3 + 8) ==
                *(short *)((long)(env->active_fpu).fpr + lVar2 + 8));
  *(ushort *)((long)(env->active_fpu).fpr + lVar1 + 10) =
       -(ushort)(*(short *)((long)(env->active_fpu).fpr + lVar3 + 10) ==
                *(short *)((long)(env->active_fpu).fpr + lVar2 + 10));
  *(ushort *)((long)(env->active_fpu).fpr + lVar1 + 0xc) =
       -(ushort)(*(short *)((long)(env->active_fpu).fpr + lVar3 + 0xc) ==
                *(short *)((long)(env->active_fpu).fpr + lVar2 + 0xc));
  *(ushort *)((long)(env->active_fpu).fpr + lVar1 + 0xe) =
       -(ushort)(*(short *)((long)(env->active_fpu).fpr + lVar3 + 0xe) ==
                *(short *)((long)(env->active_fpu).fpr + lVar2 + 0xe));
  return;
}

Assistant:

void helper_msa_ceq_h(CPUMIPSState *env, uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->h[0]  = msa_ceq_h(pws->h[0],  pwt->h[0]);
    pwd->h[1]  = msa_ceq_h(pws->h[1],  pwt->h[1]);
    pwd->h[2]  = msa_ceq_h(pws->h[2],  pwt->h[2]);
    pwd->h[3]  = msa_ceq_h(pws->h[3],  pwt->h[3]);
    pwd->h[4]  = msa_ceq_h(pws->h[4],  pwt->h[4]);
    pwd->h[5]  = msa_ceq_h(pws->h[5],  pwt->h[5]);
    pwd->h[6]  = msa_ceq_h(pws->h[6],  pwt->h[6]);
    pwd->h[7]  = msa_ceq_h(pws->h[7],  pwt->h[7]);
}